

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseExtend
          (Parser *this,RepeatedPtrField<google::protobuf::FieldDescriptorProto> *extensions,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages,
          LocationRecorder *parent_location,int location_field_number_for_nested_type,
          LocationRecorder *extend_location,FileDescriptorProto *containing_file)

{
  bool bVar1;
  bool bVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *field;
  Arena *arena;
  string_view text;
  string_view text_00;
  string_view text_01;
  string extendee;
  LocationRecorder extendee_location;
  LocationRecorder location;
  Token extendee_end;
  Token extendee_start;
  
  text._M_str = "extend";
  text._M_len = 6;
  bVar1 = Consume(this,text);
  if (bVar1) {
    io::Tokenizer::Token::Token(&extendee_start,&this->input_->current_);
    extendee._M_dataplus._M_p = (pointer)&extendee.field_2;
    extendee._M_string_length = 0;
    extendee.field_2._M_local_buf[0] = '\0';
    bVar1 = ParseUserDefinedType(this,&extendee);
    if (bVar1) {
      io::Tokenizer::Token::Token(&extendee_end,&this->input_->previous_);
      text_00._M_str = "{";
      text_00._M_len = 1;
      bVar1 = ConsumeEndOfDeclaration(this,text_00,extend_location);
      if (bVar1) {
        bVar1 = true;
        do {
          if ((this->input_->current_).type == TYPE_END) {
            bVar1 = false;
            RecordError(this,(ErrorMaker)ZEXT816(0x2fb927));
            goto LAB_001ab866;
          }
          LocationRecorder::LocationRecorder
                    (&location,extend_location,
                     (extensions->super_RepeatedPtrFieldBase).current_size_);
          field = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                            (&extensions->super_RepeatedPtrFieldBase);
          LocationRecorder::LocationRecorder(&extendee_location,&location,2);
          LocationRecorder::StartAt(&extendee_location,&extendee_start);
          LocationRecorder::EndAt(&extendee_location,&extendee_end);
          if (bVar1) {
            LocationRecorder::RecordLegacyLocation
                      (&extendee_location,&field->super_Message,EXTENDEE);
          }
          LocationRecorder::~LocationRecorder(&extendee_location);
          *(byte *)&field->field_0 = *(byte *)&field->field_0 | 2;
          arena = (Arena *)(field->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)arena & 1) != 0) {
            arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
          }
          internal::ArenaStringPtr::Set<>(&(field->field_0)._impl_.extendee_,&extendee,arena);
          bVar1 = ParseMessageField(this,field,messages,parent_location,
                                    location_field_number_for_nested_type,&location,containing_file)
          ;
          if (!bVar1) {
            SkipStatement(this);
          }
          LocationRecorder::~LocationRecorder(&location);
          text_01._M_str = "}";
          text_01._M_len = 1;
          bVar2 = TryConsumeEndOfDeclaration(this,text_01,(LocationRecorder *)0x0);
          bVar1 = false;
        } while (!bVar2);
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
LAB_001ab866:
      std::__cxx11::string::~string((string *)&extendee_end.text);
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&extendee);
    std::__cxx11::string::~string((string *)&extendee_start.text);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Parser::ParseExtend(RepeatedPtrField<FieldDescriptorProto>* extensions,
                         RepeatedPtrField<DescriptorProto>* messages,
                         const LocationRecorder& parent_location,
                         int location_field_number_for_nested_type,
                         const LocationRecorder& extend_location,
                         const FileDescriptorProto* containing_file) {
  DO(Consume("extend"));

  // Parse the extendee type.
  io::Tokenizer::Token extendee_start = input_->current();
  std::string extendee;
  DO(ParseUserDefinedType(&extendee));
  io::Tokenizer::Token extendee_end = input_->previous();

  // Parse the block.
  DO(ConsumeEndOfDeclaration("{", &extend_location));

  bool is_first = true;

  do {
    if (AtEnd()) {
      RecordError("Reached end of input in extend definition (missing '}').");
      return false;
    }

    // Note that kExtensionFieldNumber was already pushed by the parent.
    LocationRecorder location(extend_location, extensions->size());

    FieldDescriptorProto* field = extensions->Add();

    {
      LocationRecorder extendee_location(
          location, FieldDescriptorProto::kExtendeeFieldNumber);
      extendee_location.StartAt(extendee_start);
      extendee_location.EndAt(extendee_end);

      if (is_first) {
        extendee_location.RecordLegacyLocation(
            field, DescriptorPool::ErrorCollector::EXTENDEE);
        is_first = false;
      }
    }

    field->set_extendee(extendee);

    if (!ParseMessageField(field, messages, parent_location,
                           location_field_number_for_nested_type, location,
                           containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  } while (!TryConsumeEndOfDeclaration("}", nullptr));

  return true;
}